

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O1

void __thiscall deqp::gles2::Performance::ConditionalCase::deinit(ConditionalCase *this)

{
  pointer pfVar1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar2 = (*((this->super_ControlStatementCase).super_ShaderPerformanceCase.m_renderCtx)->
            _vptr_RenderContext[3])();
  pfVar1 = (this->m_comparisonValueArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_comparisonValueArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    (this->m_comparisonValueArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar1;
  }
  if (this->m_arrayBuffer != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x438))(1,&this->m_arrayBuffer);
    this->m_arrayBuffer = 0;
  }
  deqp::gls::ShaderPerformanceCase::deinit((ShaderPerformanceCase *)this);
  return;
}

Assistant:

void ConditionalCase::deinit (void)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	m_comparisonValueArray.clear();

	if (m_arrayBuffer != 0)
	{
		gl.deleteBuffers(1, &m_arrayBuffer);
		m_arrayBuffer = 0;
	}

	ShaderPerformanceCase::deinit();
}